

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void __thiscall
UIContext::Detail::Detail
          (Detail *this,GraphicsContext *context,function<void_(ApplicationContextBase_&)> *run,
          string *window_name,int width,int height)

{
  char *version;
  GLFWwindow *sz_io;
  ImGuiContext *pIVar1;
  ImGuiIO *window;
  string *in_RCX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  char *glsl_version;
  ImGuiIO *io;
  GLFWGraphicsContext *gc;
  ImGuiStyle *in_stack_000002a0;
  GLFWwindow *in_stack_00000320;
  GLFWmonitor *in_stack_00000328;
  char *in_stack_00000330;
  int in_stack_00000338;
  int in_stack_0000033c;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  GLFWwindow *in_stack_ffffffffffffff60;
  function<void_(ApplicationContextBase_&)> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  ImFontAtlas *shared_font_atlas;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  shared_font_atlas = (ImFontAtlas *)(in_RDI + 2);
  std::__cxx11::string::string((string *)shared_font_atlas,in_RCX);
  std::function<void_(ApplicationContextBase_&)>::function
            ((function<void_(ApplicationContextBase_&)> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  setGlfwFlags();
  glfwWindowHint((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60);
  if (in_RSI == 0) {
    version = (char *)0x0;
  }
  else {
    version = (char *)__dynamic_cast(in_RSI,&GraphicsContext::typeinfo,
                                     &GLFWGraphicsContext::typeinfo,0);
  }
  std::__cxx11::string::c_str();
  sz_io = glfwCreateWindow(in_stack_0000033c,in_stack_00000338,in_stack_00000330,in_stack_00000328,
                           in_stack_00000320);
  *in_RDI = sz_io;
  glfwMakeContextCurrent(in_stack_ffffffffffffff60);
  ImGui::DebugCheckVersionAndDataLayout
            (version,(size_t)sz_io,CONCAT44(in_R9D,in_R8D),(size_t)in_stack_ffffffffffffff68,
             (size_t)in_stack_ffffffffffffff60,
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  pIVar1 = ImGui::CreateContext(shared_font_atlas);
  in_RDI[1] = pIVar1;
  window = ImGui::GetIO();
  ImGui::StyleColorsDark(in_stack_000002a0);
  ImGui_ImplGlfw_InitForOpenGL((GLFWwindow *)window,(bool)in_stack_ffffffffffffff5f);
  ImGui_ImplOpenGL3_Init((char *)window);
  glfwMakeContextCurrent((GLFWwindow *)window);
  return;
}

Assistant:

Detail(GraphicsContext& context,
           std::function<void(ApplicationContextBase&)> run,
           const std::string& window_name, int width, int height)
        : _window_name(window_name), _run(run)
    {
        setGlfwFlags();
        glfwWindowHint(GLFW_VISIBLE, GLFW_TRUE);

        GLFWGraphicsContext* gc = dynamic_cast<GLFWGraphicsContext*>(&context);

        _window = glfwCreateWindow(width, height, window_name.c_str(), NULL, gc->_window);
        glfwMakeContextCurrent(_window);

        // Setup Dear ImGui context
        IMGUI_CHECKVERSION();
        _context = ImGui::CreateContext();
        ImGuiIO& io = ImGui::GetIO(); (void)io;
        //io.ConfigFlags |= ImGuiConfigFlags_NavEnableKeyboard;  // Enable Keyboard Controls
        //io.ConfigFlags |= ImGuiConfigFlags_NavEnableGamepad;   // Enable Gamepad Controls

        // Setup Dear ImGui style
        ImGui::StyleColorsDark();
        //ImGui::StyleColorsClassic();

        // Setup Platform/Renderer bindings
        const char* glsl_version = "#version 150";
        ImGui_ImplGlfw_InitForOpenGL(_window, true);
        ImGui_ImplOpenGL3_Init(glsl_version);
    
        // the context should only be captured when it's in use, as it can't be
        // captured in two places at once
        glfwMakeContextCurrent(nullptr);
    }